

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O1

void Omega_h::transfer_common2<long>
               (Mesh *old_mesh,Mesh *new_mesh,Int ent_dim,LOs *same_ents2old_ents,
               LOs *same_ents2new_ents,TagBase *tagbase,Write<signed_char> *new_data)

{
  int *piVar1;
  Alloc *pAVar2;
  Int width;
  Read<signed_char> same_data;
  Read<signed_char> old_data;
  LOs local_d0;
  Read<signed_char> local_c0;
  LOs local_b0;
  Write<signed_char> local_a0;
  Write<signed_char> local_90;
  Read<signed_char> local_80;
  Alloc *local_70;
  void *local_68;
  Alloc *local_60;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  TagBase *local_48;
  Write<signed_char> local_40;
  
  local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)new_mesh;
  TagBase::name_abi_cxx11_(tagbase);
  local_48 = tagbase;
  width = TagBase::ncomps(tagbase);
  Mesh::get_array<long>((Mesh *)&local_60,(Int)old_mesh,(string *)(ulong)(uint)ent_dim);
  local_b0.write_.shared_alloc_.alloc = (same_ents2old_ents->write_).shared_alloc_.alloc;
  if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0.write_.shared_alloc_.alloc =
           (Alloc *)((local_b0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_b0.write_.shared_alloc_.alloc)->use_count =
           (local_b0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b0.write_.shared_alloc_.direct_ptr = (same_ents2old_ents->write_).shared_alloc_.direct_ptr;
  local_80.write_.shared_alloc_.alloc = local_60;
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.write_.shared_alloc_.alloc = (Alloc *)(local_60->size * 8 + 1);
    }
    else {
      local_60->use_count = local_60->use_count + 1;
    }
  }
  local_80.write_.shared_alloc_.direct_ptr = local_58;
  unmap<long>((Omega_h *)&local_40,&local_b0,&local_80,width);
  read<long>((Omega_h *)&local_70,&local_40);
  if (((ulong)local_40.shared_alloc_.alloc & 7) == 0 && local_40.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_40.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40.shared_alloc_.alloc);
      operator_delete(local_40.shared_alloc_.alloc,0x48);
    }
  }
  pAVar2 = local_80.write_.shared_alloc_.alloc;
  if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_b0.write_.shared_alloc_.alloc;
  if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_b0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_c0.write_.shared_alloc_.alloc = local_70;
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0.write_.shared_alloc_.alloc = (Alloc *)(local_70->size * 8 + 1);
    }
    else {
      local_70->use_count = local_70->use_count + 1;
    }
  }
  local_c0.write_.shared_alloc_.direct_ptr = local_68;
  local_d0.write_.shared_alloc_.alloc = (same_ents2new_ents->write_).shared_alloc_.alloc;
  if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d0.write_.shared_alloc_.alloc =
           (Alloc *)((local_d0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_d0.write_.shared_alloc_.alloc)->use_count =
           (local_d0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_d0.write_.shared_alloc_.direct_ptr = (same_ents2new_ents->write_).shared_alloc_.direct_ptr;
  local_90.shared_alloc_.alloc = (new_data->shared_alloc_).alloc;
  if (((ulong)local_90.shared_alloc_.alloc & 7) == 0 && local_90.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_90.shared_alloc_.alloc = (Alloc *)((local_90.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_90.shared_alloc_.alloc)->use_count = (local_90.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.shared_alloc_.direct_ptr = (new_data->shared_alloc_).direct_ptr;
  map_into<long>(&local_c0,&local_d0,&local_90,width);
  pAVar2 = local_90.shared_alloc_.alloc;
  if (((ulong)local_90.shared_alloc_.alloc & 7) == 0 && local_90.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_90.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_90.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_d0.write_.shared_alloc_.alloc;
  if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_d0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d0.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_c0.write_.shared_alloc_.alloc;
  if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_c0.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c0.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_a0.shared_alloc_.alloc = (new_data->shared_alloc_).alloc;
  if (((ulong)local_a0.shared_alloc_.alloc & 7) == 0 && local_a0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_a0.shared_alloc_.alloc = (Alloc *)((local_a0.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_a0.shared_alloc_.alloc)->use_count = (local_a0.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a0.shared_alloc_.direct_ptr = (new_data->shared_alloc_).direct_ptr;
  transfer_common3<long>((Mesh *)local_50._M_pi,ent_dim,local_48,&local_a0);
  pAVar2 = local_a0.shared_alloc_.alloc;
  if (((ulong)local_a0.shared_alloc_.alloc & 7) == 0 && local_a0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_a0.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a0.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    piVar1 = &local_70->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_70);
      operator_delete(local_70,0x48);
    }
  }
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    piVar1 = &local_60->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60);
      operator_delete(local_60,0x48);
    }
  }
  return;
}

Assistant:

void transfer_common2(Mesh* old_mesh, Mesh* new_mesh, Int ent_dim,
    LOs same_ents2old_ents, LOs same_ents2new_ents, TagBase const* tagbase,
    Write<T> new_data) {
  auto const& name = tagbase->name();
  auto ncomps = tagbase->ncomps();
  auto old_data = old_mesh->get_array<T>(ent_dim, name);
  auto same_data = read(unmap(same_ents2old_ents, old_data, ncomps));
  map_into(same_data, same_ents2new_ents, new_data, ncomps);
  transfer_common3(new_mesh, ent_dim, tagbase, new_data);
}